

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::BaseModeFunction<duckdb::ModeStandard<signed_char>>::
     Execute<signed_char,duckdb::ModeState<signed_char,duckdb::ModeStandard<signed_char>>,duckdb::ModeFunction<duckdb::ModeStandard<signed_char>>>
               (ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *state,char *key,
               AggregateInputData *input_data)

{
  MAP_TYPE *pMVar1;
  mapped_type *pmVar2;
  unsigned_long uVar3;
  long in_RDI;
  mapped_type *i;
  key_type *in_stack_ffffffffffffffd8;
  ArenaAllocator *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    pMVar1 = ModeStandard<signed_char>::CreateEmpty(in_stack_ffffffffffffffe0);
    *(MAP_TYPE **)(in_RDI + 0x18) = pMVar1;
  }
  pmVar2 = std::
           unordered_map<signed_char,_duckdb::ModeAttr,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_duckdb::ModeAttr>_>_>
           ::operator[]((unordered_map<signed_char,_duckdb::ModeAttr,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_duckdb::ModeAttr>_>_>
                         *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar2->count = pmVar2->count + 1;
  uVar3 = MinValue<unsigned_long>(pmVar2->first_row,*(unsigned_long *)(in_RDI + 0x38));
  pmVar2->first_row = uVar3;
  *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 1;
  return;
}

Assistant:

static void Execute(STATE &state, const INPUT_TYPE &key, AggregateInputData &input_data) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(input_data.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		++i.count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		++state.count;
	}